

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O1

void senjo::ChessEngine::Timer(void *data)

{
  __suseconds_t _Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint64_t uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  int movenum;
  int seldepth;
  int depth;
  timeval tv;
  uint64_t nodes;
  uint64_t msecs;
  ulong local_48;
  uint64_t qnodes;
  char move [8];
  
  if (data == (void *)0x0) {
    Output::Output((Output *)&tv,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ChessEngine::Timer() NULL data parameter",0x28);
  }
  else {
    uVar3 = (**(code **)(*data + 0x98))();
    depth = 0;
    movenum = 0;
    seldepth = 0;
    msecs = 0;
    nodes = 0;
    qnodes = 0;
    local_48 = (ulong)uVar3;
    do {
      if (_quit != '\0') break;
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var1 = tv.tv_usec;
      lVar9 = tv.tv_sec * 1000;
      lVar5 = (**(code **)(*data + 0xe8))(data);
      cVar2 = (**(code **)(*data + 0xd8))(data);
      uVar8 = _Var1 / 1000 + lVar9;
      if (cVar2 != '\0') {
        if (lVar5 - 1U < uVar8 + 100) {
          (**(code **)(*data + 0xf8))(data);
        }
        else {
          lVar9 = (**(code **)(*data + 0x108))(data);
          if ((lVar9 == 0) && (uVar6 = Output::LastOutput(), uVar6 + local_48 <= uVar8)) {
            (**(code **)(*data + 0x80))(data,&depth,&seldepth,&nodes,&qnodes,&msecs,&movenum,move,8)
            ;
            Output::Output((Output *)&tv,NoPrefix);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"info depth ",0xb);
            std::ostream::operator<<((ostream *)&std::cout,depth);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," seldepth ",10);
            std::ostream::operator<<((ostream *)&std::cout,seldepth);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nodes ",7);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," time ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nps ",5);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            if (0 < movenum) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," currmovenumber ",0x10);
              std::ostream::operator<<((ostream *)&std::cout,movenum);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," currmove ",10);
              sVar7 = strlen(move);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,move,sVar7);
            }
            Output::~Output((Output *)&tv);
          }
        }
      }
      uVar8 = (lVar5 - uVar8) - 100;
      if (99 < uVar8) {
        uVar8 = 100;
      }
      iVar4 = usleep((int)uVar8 * 1000);
    } while (iVar4 == 0);
    if (_debug != '\x01') {
      return;
    }
    Output::Output((Output *)&tv,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ChessEngine::Timer thread exiting",0x21);
  }
  Output::~Output((Output *)&tv);
  return;
}

Assistant:

void ChessEngine::Timer(void* data)
{
  try {
    if (!data) {
      Output() << "ChessEngine::Timer() NULL data parameter";
      return;
    }

    ChessEngine* engine;
#ifdef NDEBUG
    engine = static_cast<ChessEngine*>(data);
#else
    engine = reinterpret_cast<ChessEngine*>(data);
    if (!engine) {
      Output() << "ChessEngine::Timer() failed to cast data parameter";
      return;
    }
#endif

    const unsigned int outputInterval = engine->TimerOutputInterval();

    char     move[8];
    int      depth = 0;
    int      movenum = 0;
    int      seldepth = 0;
    uint64_t msecs = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;

    while (!_quit) {
      const uint64_t now = Now();
      const uint64_t end = engine->GetStopTime();

      if (engine->IsSearching()) {
        if (end && ((now + 100) >= end)) {
          engine->Stop(StopReason::Timeout);
        }
        else if (!engine->TimeoutOccurred() &&
                 (now >= (Output::LastOutput() + outputInterval)))
        {
          engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &msecs,
                           &movenum, move, sizeof(move));

          Output out(Output::NoPrefix);
          out << "info depth " << depth
              << " seldepth " << seldepth
              << " nodes " << nodes
              << " time " << msecs
              << " nps " << static_cast<uint64_t>(Rate(nodes, msecs));

          if (movenum > 0) {
            out << " currmovenumber " << movenum
                << " currmove " << move;
          }
        }
      }

      const uint64_t tmout = (end - now - 100);
      const uint64_t msecs = std::min<uint64_t>(100, tmout);
      if (!MillisecondSleep(static_cast<unsigned int>(msecs))) {
        break;
      }
    }
  }
  catch (std::exception& e) {
    std::cerr << "info string ChessEngine::Timer() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "info string ChessEngine::Timer() ERROR: unknown exception"
              << std::endl;
  }

  if (_debug) {
    Output() << "ChessEngine::Timer thread exiting";
  }
}